

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall
testing::internal::anon_unknown_38::PositiveAndNegativeUnitTestFilter::MatchesTest
          (PositiveAndNegativeUnitTestFilter *this,string *test_suite_name,string *test_name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,test_suite_name,".");
  std::operator+(&bStack_58,&local_38,test_name);
  bVar1 = UnitTestFilter::MatchesName(&this->positive_filter_,&bStack_58);
  if (bVar1) {
    bVar1 = UnitTestFilter::MatchesName(&this->negative_filter_,&bStack_58);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool MatchesTest(const std::string& test_suite_name,
                   const std::string& test_name) const {
    return MatchesName(test_suite_name + "." + test_name);
  }